

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O3

int main(void)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  GLFWwindow *handle;
  int scancode;
  bool bVar4;
  long lVar5;
  double dVar6;
  
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 == 0) {
LAB_00106dd2:
    exit(1);
  }
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    iVar3 = 0;
    handle = glfwCreateWindow(W,H,"Cursor testing",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    windows[lVar5] = handle;
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00106dd2;
    }
    glfwSetWindowPos(handle,(int)lVar5 * (W + 0x32) + 100,100);
    glfwSetWindowRefreshCallback(windows[lVar5],refresh_callback);
    glfwSetFramebufferSizeCallback(windows[lVar5],framebuffer_size_callback);
    glfwSetKeyCallback(windows[lVar5],key_callback);
    glfwSetWindowFocusCallback(windows[lVar5],focus_callback);
    glfwMakeContextCurrent(windows[lVar5]);
    glClear(0x4000);
    glfwSwapBuffers(windows[lVar5]);
    lVar5 = 1;
    bVar2 = false;
  } while (bVar4);
  activeWindow = windows[0];
  key_callback((GLFWwindow *)0x0,0x48,scancode,1,iVar3);
  while( true ) {
    if (delay != 0) {
      dVar6 = glfwGetTime();
      lVar5 = 0;
      do {
        dVar1 = *(double *)((long)&commands[0].time + lVar5);
        if (((dVar1 != 0.0) || (NAN(dVar1))) && (3.0 <= dVar6 - dVar1)) {
          command_callback(*(int *)((long)&commands[0].key + lVar5));
          *(undefined8 *)((long)&commands[0].time + lVar5) = 0;
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x80);
    }
    iVar3 = glfwWindowShouldClose(windows[0]);
    if (iVar3 != 0) break;
    iVar3 = glfwWindowShouldClose(windows[1]);
    glfwPollEvents();
    if (iVar3 != 0) {
LAB_00106de1:
      glfwTerminate();
      exit(0);
    }
  }
  glfwPollEvents();
  goto LAB_00106de1;
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (i = 0; i < 2; i++)
    {
        windows[i] = glfwCreateWindow(W, H, "Cursor testing", NULL, NULL);

        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowPos(windows[i], 100 + (i & 1) * (W + 50), 100);

        glfwSetWindowRefreshCallback(windows[i], refresh_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetWindowFocusCallback(windows[i], focus_callback);

        glfwMakeContextCurrent(windows[i]);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(windows[i]);
    }

    activeWindow = windows[0];

    key_callback(NULL, GLFW_KEY_H, 0, GLFW_PRESS, 0);

    while (running)
    {
        if (delay)
        {
            int i;
            double t = glfwGetTime();

            for (i = 0; i < CommandCount; i++)
            {
                if (commands[i].time != 0 && t - commands[i].time >= 3.0)
                {
                    command_callback(commands[i].key);
                    commands[i].time = 0;
                }
            }
        }

        running = !(glfwWindowShouldClose(windows[0]) || glfwWindowShouldClose(windows[1]));

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}